

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetImageSetDimensions(IceTImage image,IceTSizeType width,IceTSizeType height)

{
  IceTSizeType IVar1;
  char *msg;
  int line;
  
  if (image.opaque_internals == (IceTVoid *)0x0) {
    msg = "Cannot set number of pixels on null image.";
    line = 0x23e;
  }
  else {
    if (height * width <= *(int *)((long)image.opaque_internals + 0x14)) {
      *(IceTSizeType *)((long)image.opaque_internals + 0xc) = width;
      *(IceTSizeType *)((long)image.opaque_internals + 0x10) = height;
      IVar1 = icetImageBufferSizeType
                        (*(IceTEnum *)((long)image.opaque_internals + 4),
                         *(IceTEnum *)((long)image.opaque_internals + 8),width,height);
      *(IceTSizeType *)((long)image.opaque_internals + 0x18) = IVar1;
      return;
    }
    msg = "Cannot set an image size to greater than what the image was originally created.";
    line = 0x245;
  }
  icetRaiseDiagnostic(msg,0xfffffffa,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,line);
  return;
}

Assistant:

void icetImageSetDimensions(IceTImage image,
                            IceTSizeType width,
                            IceTSizeType height)
{
    ICET_TEST_IMAGE_HEADER(image);

    if (icetImageIsNull(image)) {
        icetRaiseError("Cannot set number of pixels on null image.",
                       ICET_INVALID_VALUE);
        return;
    }

    if (   width*height
         > ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX] ){
        icetRaiseError("Cannot set an image size to greater than what the"
                       " image was originally created.", ICET_INVALID_VALUE);
        return;
    }

    ICET_IMAGE_HEADER(image)[ICET_IMAGE_WIDTH_INDEX] = (IceTInt)width;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_HEIGHT_INDEX] = (IceTInt)height;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX]
        = (IceTInt)icetImageBufferSizeType(icetImageGetColorFormat(image),
                                           icetImageGetDepthFormat(image),
                                           width,
                                           height);
}